

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

size_t libcellml::getComponentIndexInComponentEntity
                 (ComponentEntityPtr *componentParent,ComponentEntityPtr *component)

{
  size_t sVar1;
  bool bVar2;
  ComponentEntity local_40;
  
  sVar1 = 0;
  bVar2 = false;
  while (!bVar2) {
    ComponentEntity::component
              (&local_40,
               (size_t)(componentParent->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    bVar2 = (element_type *)
            local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity ==
            (component->super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    sVar1 = sVar1 + !bVar2;
  }
  return sVar1;
}

Assistant:

size_t getComponentIndexInComponentEntity(const ComponentEntityPtr &componentParent, const ComponentEntityPtr &component)
{
    size_t index = 0;
    bool found = false;
    while (!found) {
        if (componentParent->component(index) == component) {
            found = true;
        } else {
            ++index;
        }
    }

    return index;
}